

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O1

size_t __thiscall meshopt::VertexStreamHasher::hash(VertexStreamHasher *this,uint index)

{
  meshopt_Stream *pmVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  int *piVar5;
  
  uVar2 = 0;
  if (this->stream_count != 0) {
    sVar3 = 0;
    do {
      uVar4 = this->streams[sVar3].size;
      if (3 < uVar4) {
        pmVar1 = this->streams + sVar3;
        piVar5 = (int *)(pmVar1->stride * (ulong)index + (long)pmVar1->data);
        do {
          uVar2 = (ulong)((int)uVar2 * 0x5bd1e995 ^
                         ((uint)(*piVar5 * 0x5bd1e995) >> 0x18 ^ *piVar5 * 0x5bd1e995) * 0x5bd1e995)
          ;
          piVar5 = piVar5 + 1;
          uVar4 = uVar4 - 4;
        } while (3 < uVar4);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != this->stream_count);
  }
  return uVar2;
}

Assistant:

size_t hash(unsigned int index) const
	{
		unsigned int h = 0;

		for (size_t i = 0; i < stream_count; ++i)
		{
			const meshopt_Stream& s = streams[i];
			const unsigned char* data = static_cast<const unsigned char*>(s.data);

			h = hashUpdate4(h, data + index * s.stride, s.size);
		}

		return h;
	}